

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qthread.cpp
# Opt level: O2

void QThread::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  Priority priority;
  int __status;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QThread::*)(QThread::QPrivateSignal)>
                      ((QtMocHelpers *)_a,(void **)started,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QThread::*)(QThread::QPrivateSignal)>
                ((QtMocHelpers *)_a,(void **)finished,0,1);
      return;
    }
switchD_00306a82_default:
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    started();
    return;
  case 1:
    finished();
    return;
  case 2:
    priority = *_a[1];
    break;
  case 3:
    priority = InheritPriority;
    break;
  case 4:
    terminate((QThread *)_o);
    return;
  case 5:
    __status = *_a[1];
    goto LAB_00306ae6;
  case 6:
    __status = 0;
LAB_00306ae6:
    exit((QThread *)_o,__status);
    return;
  case 7:
    quit((QThread *)_o);
    return;
  default:
    goto switchD_00306a82_default;
  }
  start((QThread *)_o,priority);
  return;
}

Assistant:

void QThread::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QThread *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished(QPrivateSignal()); break;
        case 2: _t->start((*reinterpret_cast< std::add_pointer_t<Priority>>(_a[1]))); break;
        case 3: _t->start(); break;
        case 4: _t->terminate(); break;
        case 5: _t->exit((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->exit(); break;
        case 7: _t->quit(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::finished, 1))
            return;
    }
}